

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O2

void __thiscall
TEST_TestFailure_CreateFailure_Test::testBody(TEST_TestFailure_CreateFailure_Test *this)

{
  UtestShell *pUVar1;
  TestFailure f3;
  TestFailure f2;
  TestFailure f1;
  
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)&f2,"the failure message");
  TestFailure::TestFailure(&f1,pUVar1,"fail.cpp",2,(SimpleString *)&f2);
  SimpleString::~SimpleString((SimpleString *)&f2);
  pUVar1 = (this->super_TEST_GROUP_CppUTestGroupTestFailure).test;
  SimpleString::SimpleString((SimpleString *)&f3,"the failure message");
  TestFailure::TestFailure(&f2,pUVar1,(SimpleString *)&f3);
  SimpleString::~SimpleString((SimpleString *)&f3);
  TestFailure::TestFailure(&f3,(this->super_TEST_GROUP_CppUTestGroupTestFailure).test,"fail.cpp",2);
  TestFailure::~TestFailure(&f3);
  TestFailure::~TestFailure(&f2);
  TestFailure::~TestFailure(&f1);
  return;
}

Assistant:

TEST(TestFailure, CreateFailure)
{
    TestFailure f1(test, failFileName, failLineNumber, "the failure message");
    TestFailure f2(test, "the failure message");
    TestFailure f3(test, failFileName, failLineNumber);
}